

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O2

void Ssw_SmlObjAssignConst(Ssw_Sml_t *p,Aig_Obj_t *pObj,int fConst1,int iFrame)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  
  if (p->nFrames <= iFrame) {
    __assert_fail("iFrame < p->nFrames",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswSim.c"
                  ,0x234,"void Ssw_SmlObjAssignConst(Ssw_Sml_t *, Aig_Obj_t *, int, int)");
  }
  if ((*(uint *)&pObj->field_0x18 & 7) == 2) {
    iVar1 = p->nWordsTotal;
    iVar2 = pObj->Id;
    iVar5 = p->nWordsFrame;
    iVar4 = iFrame * iVar5;
    for (lVar3 = 0; lVar3 < iVar5; lVar3 = lVar3 + 1) {
      *(uint *)((long)&p[1].pAig + lVar3 * 4 + (long)iVar4 * 4 + (long)(iVar1 * iVar2) * 4) =
           -(uint)(fConst1 != 0);
      iVar5 = p->nWordsFrame;
    }
    return;
  }
  __assert_fail("Aig_ObjIsCi(pObj)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswSim.c"
                ,0x235,"void Ssw_SmlObjAssignConst(Ssw_Sml_t *, Aig_Obj_t *, int, int)");
}

Assistant:

void Ssw_SmlObjAssignConst( Ssw_Sml_t * p, Aig_Obj_t * pObj, int fConst1, int iFrame )
{
    unsigned * pSims;
    int i;
    assert( iFrame < p->nFrames );
    assert( Aig_ObjIsCi(pObj) );
    pSims = Ssw_ObjSim( p, pObj->Id ) + p->nWordsFrame * iFrame;
    for ( i = 0; i < p->nWordsFrame; i++ )
        pSims[i] = fConst1? ~(unsigned)0 : 0;
}